

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManCollectOverlapCands(Nwk_Obj_t *pLut,Vec_Ptr_t *vCands,Nwk_LMPars_t *pPars)

{
  undefined1 *puVar1;
  uint uVar2;
  Nwk_Obj_t *pNVar3;
  Nwk_Obj_t *pNVar4;
  int iVar5;
  long lVar6;
  void **ppvVar7;
  int iVar8;
  long lVar9;
  
  if (0 < pLut->nFanins) {
    lVar6 = 0;
    do {
      if (pLut->pFanio[lVar6] == (Nwk_Obj_t *)0x0) break;
      puVar1 = &pLut->pFanio[lVar6]->field_0x20;
      *puVar1 = *puVar1 | 0x40;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pLut->nFanins);
  }
  vCands->nSize = 0;
  Nwk_ManIncrementTravId(pLut->pMan);
  pLut->TravId = pLut->pMan->nTravIds;
  if (0 < pLut->nFanins) {
    lVar6 = 0;
    do {
      pNVar3 = pLut->pFanio[lVar6];
      if (pNVar3 == (Nwk_Obj_t *)0x0) break;
      if ((((*(uint *)&pNVar3->field_0x20 & 7) == 3) && (pNVar3->nFanouts <= pPars->nMaxFanout)) &&
         (0 < pNVar3->nFanouts)) {
        iVar8 = 0;
        do {
          pNVar4 = pNVar3->pFanio[(long)iVar8 + (long)pNVar3->nFanins];
          if (pNVar4 == (Nwk_Obj_t *)0x0) break;
          if ((((*(uint *)&pNVar4->field_0x20 & 7) == 3) &&
              (iVar5 = pNVar4->pMan->nTravIds, pNVar4->TravId != iVar5)) &&
             (pNVar4->TravId = iVar5,
             pNVar4->Level - pLut->Level <= pPars->nMaxLevelDiff &&
             pLut->Level - pNVar4->Level <= pPars->nMaxLevelDiff)) {
            iVar5 = pLut->nFanins;
            if (0 < (long)pNVar4->nFanins) {
              lVar9 = 0;
              do {
                if (pNVar4->pFanio[lVar9] == (Nwk_Obj_t *)0x0) break;
                iVar5 = iVar5 + (uint)((pNVar4->pFanio[lVar9]->field_0x20 & 0x40) == 0);
                lVar9 = lVar9 + 1;
              } while (pNVar4->nFanins != lVar9);
            }
            if (iVar5 <= pPars->nMaxSuppSize) {
              uVar2 = vCands->nCap;
              if (vCands->nSize == uVar2) {
                if ((int)uVar2 < 0x10) {
                  if (vCands->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar7 = (void **)realloc(vCands->pArray,0x80);
                  }
                  vCands->pArray = ppvVar7;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar2 * 2;
                  if (iVar5 <= (int)uVar2) goto LAB_0049780f;
                  if (vCands->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
                  }
                  else {
                    ppvVar7 = (void **)realloc(vCands->pArray,(ulong)uVar2 << 4);
                  }
                  vCands->pArray = ppvVar7;
                }
                vCands->nCap = iVar5;
              }
LAB_0049780f:
              iVar5 = vCands->nSize;
              vCands->nSize = iVar5 + 1;
              vCands->pArray[iVar5] = pNVar4;
            }
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < pNVar3->nFanouts);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pLut->nFanins);
  }
  if (0 < pLut->nFanins) {
    lVar6 = 0;
    do {
      if (pLut->pFanio[lVar6] == (Nwk_Obj_t *)0x0) {
        return;
      }
      puVar1 = &pLut->pFanio[lVar6]->field_0x20;
      *puVar1 = *puVar1 & 0xbf;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pLut->nFanins);
  }
  return;
}

Assistant:

void Nwk_ManCollectOverlapCands( Nwk_Obj_t * pLut, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Nwk_Obj_t * pFanin, * pObj;
    int i, k;
    // mark fanins of pLut
    Nwk_ObjForEachFanin( pLut, pFanin, i )
        pFanin->MarkC = 1;
    // collect the matching fanouts of each fanin of the node
    Vec_PtrClear( vCands );
    Nwk_ManIncrementTravId( pLut->pMan );
    Nwk_ObjSetTravIdCurrent( pLut );
    Nwk_ObjForEachFanin( pLut, pFanin, i )
    {
        if ( !Nwk_ObjIsNode(pFanin) )
            continue;
        if ( Nwk_ObjFanoutNum(pFanin) > pPars->nMaxFanout )
            continue;
        Nwk_ObjForEachFanout( pFanin, pObj, k )
        {
            if ( !Nwk_ObjIsNode(pObj) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pObj ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pObj );
            // check the difference in delay
            if ( Nwk_ObjLevel(pLut) - Nwk_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
                 Nwk_ObjLevel(pObj) - Nwk_ObjLevel(pLut) > pPars->nMaxLevelDiff )
                 continue;
            // check the total number of fanins of the node
            if ( Nwk_ManCountTotalFanins(pLut, pObj) > pPars->nMaxSuppSize )
                continue;
            Vec_PtrPush( vCands, pObj );
        }
    }
    // unmark fanins of pLut
    Nwk_ObjForEachFanin( pLut, pFanin, i )
        pFanin->MarkC = 0;
}